

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

optional<pbrt::LightLeSample> * __thiscall
pbrt::GoniometricLight::SampleLe
          (GoniometricLight *this,Point2f u1,Point2f u2,SampledWavelengths *lambda,Float time)

{
  Point3f o;
  Point2f p;
  LightLeSample *this_00;
  long in_RSI;
  optional<pbrt::LightLeSample> *in_RDI;
  undefined1 in_ZMM0 [64];
  undefined1 auVar1 [64];
  undefined1 auVar4 [56];
  undefined1 auVar3 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar6 [56];
  undefined1 auVar5 [64];
  undefined4 in_XMM2_Da;
  Vector3f VVar7;
  SampledSpectrum SVar8;
  Ray ray;
  Float pdfDir;
  Vector3f wLight;
  Point2f uv;
  Float pdf;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  SampledSpectrum *L;
  undefined8 uVar9;
  optional<pbrt::LightLeSample> *poVar10;
  float in_stack_fffffffffffffe20;
  float in_stack_fffffffffffffe24;
  float in_stack_fffffffffffffe28;
  Point2i *in_stack_fffffffffffffe30;
  Float *in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  Point2f in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe54;
  Tuple3<pbrt::Vector3,_float> in_stack_fffffffffffffe68;
  undefined1 local_e0 [16];
  float local_d0;
  undefined1 local_c0 [84];
  float local_6c;
  SampledWavelengths *local_68;
  float local_60;
  Transform *local_58;
  SampledWavelengths *local_50;
  float fVar11;
  undefined4 in_stack_ffffffffffffffbc;
  Ray *r;
  Transform *this_01;
  float local_30;
  undefined1 auVar2 [64];
  undefined1 extraout_var [56];
  
  r = (Ray *)vmovlpd_avx(in_ZMM0._0_16_);
  vmovlpd_avx(in_ZMM1._0_16_);
  uVar9 = 0;
  poVar10 = in_RDI;
  auVar1._0_8_ = PiecewiseConstant2D::Sample
                           ((PiecewiseConstant2D *)
                            CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                            in_stack_fffffffffffffe48,in_stack_fffffffffffffe38,
                            in_stack_fffffffffffffe30);
  auVar1._8_56_ = extraout_var;
  local_58 = (Transform *)vmovlpd_avx(auVar1._0_16_);
  auVar4 = ZEXT856(0);
  p.super_Tuple2<pbrt::Point2,_float>.y = in_stack_fffffffffffffe28;
  p.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffffe24;
  this_01 = local_58;
  VVar7 = EqualAreaSquareToSphere(p);
  local_60 = VVar7.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar2._0_8_ = VVar7.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar2._8_56_ = auVar4;
  local_68 = (SampledWavelengths *)vmovlpd_avx(auVar2._0_16_);
  local_6c = local_30 / 12.566371;
  this_00 = (LightLeSample *)(in_RSI + 4);
  local_50 = local_68;
  local_d0 = local_60;
  Point3<float>::Point3
            ((Point3<float> *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
             (float)((ulong)in_RDI >> 0x20),SUB84(in_RDI,0),0.0);
  local_e0._8_8_ = local_50;
  L = (SampledSpectrum *)local_e0;
  fVar11 = local_d0;
  Medium::Medium((Medium *)CONCAT44(in_XMM2_Da,in_stack_fffffffffffffde0),(Medium *)in_RDI);
  o.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffe20;
  o.super_Tuple3<pbrt::Point3,_float>._0_8_ = poVar10;
  VVar7.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)uVar9;
  VVar7.super_Tuple3<pbrt::Vector3,_float>.z = (float)(int)((ulong)uVar9 >> 0x20);
  VVar7.super_Tuple3<pbrt::Vector3,_float>.x = (float)((ulong)local_c0 >> 0x20);
  Ray::Ray((Ray *)CONCAT44(in_XMM2_Da,in_stack_fffffffffffffde0),o,VVar7,
           (Float)((ulong)in_RDI >> 0x20),(Medium *)0x8a401d);
  Transform::operator()(this_01,r,(Float *)CONCAT44(in_stack_ffffffffffffffbc,fVar11));
  auVar4 = ZEXT856(0);
  auVar6 = (undefined1  [56])0x0;
  SVar8 = I((GoniometricLight *)CONCAT44(in_stack_fffffffffffffe54,fVar11),
            (Vector3f)in_stack_fffffffffffffe68,local_50);
  auVar5._0_8_ = SVar8.values.values._8_8_;
  auVar5._8_56_ = auVar6;
  auVar3._0_8_ = SVar8.values.values._0_8_;
  auVar3._8_56_ = auVar4;
  vmovlpd_avx(auVar3._0_16_);
  vmovlpd_avx(auVar5._0_16_);
  LightLeSample::LightLeSample
            (this_00,L,(Ray *)CONCAT44(in_XMM2_Da,in_stack_fffffffffffffde0),
             (Float)((ulong)in_RDI >> 0x20),SUB84(in_RDI,0));
  pstd::optional<pbrt::LightLeSample>::optional
            ((optional<pbrt::LightLeSample> *)CONCAT44(in_XMM2_Da,in_stack_fffffffffffffde0),
             (LightLeSample *)in_RDI);
  LightLeSample::~LightLeSample((LightLeSample *)0x8a40e6);
  return in_RDI;
}

Assistant:

PBRT_CPU_GPU pstd::optional<LightLeSample> GoniometricLight::SampleLe(Point2f u1, Point2f u2,
                                                         SampledWavelengths &lambda,
                                                         Float time) const {
    // Sample direction and PDF for ray leaving goniometric light
    Float pdf;
    Point2f uv = distrib.Sample(u1, &pdf);
    Vector3f wLight = EqualAreaSquareToSphere(uv);
    Float pdfDir = pdf / (4 * Pi);

    Ray ray =
        renderFromLight(Ray(Point3f(0, 0, 0), wLight, time, mediumInterface.outside));
    return LightLeSample(I(wLight, lambda), ray, 1, pdfDir);
}